

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::CheckTypeStackEnd(TypeChecker *this,char *desc)

{
  Result RVar1;
  Enum EVar2;
  bool bVar3;
  Label *label;
  Label *local_40;
  TypeVector local_38;
  
  RVar1 = GetLabel(this,0,&local_40);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    bVar3 = (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2 != local_40->type_stack_limit;
    EVar2 = (Enum)bVar3;
    if (bVar3) {
      local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      RVar1.enum_._1_3_ = 0;
      RVar1.enum_._0_1_ = bVar3;
      PrintStackIfFailed(this,RVar1,desc,&local_38);
    }
  }
  return (Result)EVar2;
}

Assistant:

Result TypeChecker::CheckTypeStackEnd(const char* desc) {
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  Result result = (type_stack_.size() == label->type_stack_limit)
                      ? Result::Ok
                      : Result::Error;
  PrintStackIfFailed(result, desc);
  return result;
}